

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VaultClient.h
# Opt level: O1

Token * __thiscall Vault::Client::getToken_abi_cxx11_(Token *__return_storage_ptr__,Client *this)

{
  (__return_storage_ptr__->value_)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->value_).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,*(long *)(this + 0x50),
             *(long *)(this + 0x58) + *(long *)(this + 0x50));
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] virtual Token getToken() const { return token_; }